

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

cali_configset_t cali_create_configset(char *(*keyvallist) [2])

{
  map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *pmVar1;
  bool bVar2;
  pair<const_char_*,_const_char_*> local_30;
  map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_20;
  cali_configset_t cfg;
  char *(*keyvallist_local) [2];
  
  cfg = (cali_configset_t)keyvallist;
  pmVar1 = (map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            *)operator_new(0x30);
  _cali_configset_t::_cali_configset_t((_cali_configset_t *)pmVar1);
  local_20 = pmVar1;
  keyvallist_local = (char *(*) [2])pmVar1;
  if (cfg != (cali_configset_t)0x0) {
    while( true ) {
      pmVar1 = local_20;
      bVar2 = false;
      if (*(long *)&(cfg->cfgset)._M_t._M_impl != 0) {
        bVar2 = *(long *)&(cfg->cfgset)._M_t._M_impl.super__Rb_tree_header._M_header != 0;
      }
      if (!bVar2) break;
      local_30 = std::make_pair<char_const*&,char_const*&>
                           ((char **)cfg,(char **)&(cfg->cfgset)._M_t._M_impl.super__Rb_tree_header)
      ;
      std::
      map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::insert<std::pair<char_const*,char_const*>>(pmVar1,&local_30);
      cfg = (cali_configset_t)&(cfg->cfgset)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    }
    keyvallist_local = (char *(*) [2])local_20;
  }
  return (cali_configset_t)keyvallist_local;
}

Assistant:

cali_configset_t cali_create_configset(const char* keyvallist[][2])
{
    cali_configset_t cfg = new _cali_configset_t;

    if (!keyvallist)
        return cfg;

    for (; (*keyvallist)[0] && (*keyvallist)[1]; ++keyvallist)
        cfg->cfgset.insert(std::make_pair((*keyvallist)[0], (*keyvallist)[1]));

    return cfg;
}